

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::GetGeomPrimvar
               (Stage *stage,GPrim *gprim,string *varname,GeomPrimvar *out_primvar,string *err)

{
  bool bVar1;
  int n;
  uint32_t uVar2;
  ostream *poVar3;
  pointer_conflict ppVar4;
  AttrMeta *pAVar5;
  value_type *pvVar6;
  value_type_conflict4 *pvVar7;
  Attribute *this;
  Attribute *this_00;
  PrimVar *pPVar8;
  string local_1ba0 [39];
  allocator local_1b79;
  string local_1b78 [32];
  fmt local_1b58 [32];
  ostringstream local_1b38 [8];
  ostringstream ss_e_9;
  undefined1 local_19c0 [8];
  TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> tss_1;
  TimeSamples *ts_1;
  string local_1978;
  allocator local_1951;
  string local_1950 [32];
  fmt local_1930 [32];
  ostringstream local_1910 [8];
  ostringstream ss_e_8;
  undefined1 local_1798 [8];
  vector<int,_std::allocator<int>_> indices_1;
  ostringstream local_1760 [8];
  ostringstream ss_e_7;
  string local_15e8 [32];
  string local_15c8;
  allocator local_15a1;
  string local_15a0 [32];
  fmt local_1580 [32];
  ostringstream local_1560 [8];
  ostringstream ss_e_6;
  undefined1 local_13e8 [8];
  vector<int,_std::allocator<int>_> indices;
  allocator local_13a9;
  string local_13a8 [32];
  fmt local_1388 [32];
  ostringstream local_1368 [8];
  ostringstream ss_e_5;
  undefined1 local_11f0 [8];
  TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> tss;
  TimeSamples *ts;
  ostringstream local_11a8 [8];
  ostringstream ss_e_4;
  undefined1 local_1028 [7];
  bool ret_1;
  Attribute terminal_indexAttr;
  allocator local_d59;
  string local_d58 [32];
  fmt local_d38 [32];
  ostringstream local_d18 [8];
  ostringstream ss_e_3;
  Attribute *indexAttr;
  _Self local_b90;
  const_iterator indexIt;
  string index_name;
  allocator local_b41;
  string local_b40 [32];
  fmt local_b20 [32];
  ostringstream local_b00 [8];
  ostringstream ss_e_2;
  undefined1 local_980 [7];
  bool ret;
  Attribute terminal_attr;
  Attribute *attr;
  _Self local_6c8;
  _Self local_6c0;
  const_iterator it;
  string primvar_name;
  char *kIndices;
  char *kPrimvars;
  GeomPrimvar primvar;
  ostringstream local_348 [8];
  ostringstream ss_e_1;
  string local_1d0 [32];
  ostringstream local_1b0 [8];
  ostringstream ss_e;
  string *err_local;
  GeomPrimvar *out_primvar_local;
  string *varname_local;
  GPrim *gprim_local;
  Stage *stage_local;
  
  if (out_primvar == (GeomPrimvar *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar3 = ::std::operator<<((ostream *)local_1b0,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"GetGeomPrimvar");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xa2d);
    ::std::operator<<(poVar3," ");
    poVar3 = ::std::operator<<((ostream *)local_1b0,"Output GeomPrimvar is nullptr.");
    ::std::operator<<(poVar3,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,local_1d0);
      ::std::__cxx11::string::~string(local_1d0);
    }
    stage_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_1b0);
    goto LAB_0048896a;
  }
  if (gprim == (GPrim *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream(local_348);
    poVar3 = ::std::operator<<((ostream *)local_348,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"GetGeomPrimvar");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xa31);
    ::std::operator<<(poVar3," ");
    poVar3 = ::std::operator<<((ostream *)local_348,"Input `gprim` arg is nullptr.");
    ::std::operator<<(poVar3,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,(string *)&primvar._interpolation);
      ::std::__cxx11::string::~string((string *)&primvar._interpolation);
    }
    stage_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_348);
    goto LAB_0048896a;
  }
  GeomPrimvar::GeomPrimvar((GeomPrimvar *)&kPrimvars);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,
                   "primvars:",varname);
  local_6c0._M_node =
       (_Base_ptr)
       ::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
       ::find(&gprim->props,(key_type_conflict *)&it);
  local_6c8._M_node =
       (_Base_ptr)
       ::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
       ::end(&gprim->props);
  bVar1 = ::std::operator==(&local_6c0,&local_6c8);
  if (bVar1) {
    stage_local._7_1_ = 0;
  }
  else {
    ppVar4 = ::std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
             ::operator->(&local_6c0);
    bVar1 = Property::is_attribute(&ppVar4->second);
    if (bVar1) {
      ppVar4 = ::std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
               ::operator->(&local_6c0);
      terminal_attr._metas.stringData.
      super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)Property::get_attribute(&ppVar4->second);
      bVar1 = Attribute::is_connection
                        ((Attribute *)
                         terminal_attr._metas.stringData.
                         super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        Attribute::Attribute((Attribute *)local_980);
        bVar1 = GetTerminalAttribute
                          (stage,(Attribute *)
                                 terminal_attr._metas.stringData.
                                 super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&it,
                           (Attribute *)local_980,err);
        if (bVar1) {
          GeomPrimvar::set_value((GeomPrimvar *)&kPrimvars,(Attribute *)local_980);
        }
        else {
          stage_local._7_1_ = 0;
        }
        Attribute::~Attribute((Attribute *)local_980);
        if (!bVar1) goto LAB_00488952;
      }
      else {
        GeomPrimvar::set_value
                  ((GeomPrimvar *)&kPrimvars,
                   (Attribute *)
                   terminal_attr._metas.stringData.
                   super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      GeomPrimvar::set_name((GeomPrimvar *)&kPrimvars,varname);
      pAVar5 = Attribute::metas((Attribute *)
                                terminal_attr._metas.stringData.
                                super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = nonstd::optional_lite::optional<tinyusdz::Interpolation>::has_value
                        (&pAVar5->interpolation);
      if (bVar1) {
        pAVar5 = Attribute::metas((Attribute *)
                                  terminal_attr._metas.stringData.
                                  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar6 = nonstd::optional_lite::optional<tinyusdz::Interpolation>::value
                           (&pAVar5->interpolation);
        GeomPrimvar::set_interpolation((GeomPrimvar *)&kPrimvars,*pvVar6);
      }
      pAVar5 = Attribute::metas((Attribute *)
                                terminal_attr._metas.stringData.
                                super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = nonstd::optional_lite::optional<unsigned_int>::has_value(&pAVar5->elementSize);
      if (bVar1) {
        pAVar5 = Attribute::metas((Attribute *)
                                  terminal_attr._metas.stringData.
                                  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar7 = nonstd::optional_lite::optional<unsigned_int>::value(&pAVar5->elementSize);
        GeomPrimvar::set_elementSize((GeomPrimvar *)&kPrimvars,*pvVar7);
      }
      pAVar5 = Attribute::metas((Attribute *)
                                terminal_attr._metas.stringData.
                                super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = AttrMetas::has_unauthoredValuesIndex(pAVar5);
      if (bVar1) {
        pAVar5 = Attribute::metas((Attribute *)
                                  terminal_attr._metas.stringData.
                                  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
        n = AttrMetas::get_unauthoredValuesIndex(pAVar5);
        GeomPrimvar::set_unauthoredValuesIndex((GeomPrimvar *)&kPrimvars,n);
      }
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&indexIt
                       ,(char *)&it);
      local_b90._M_node =
           (_Base_ptr)
           ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
           ::find(&gprim->props,(key_type_conflict *)&indexIt);
      indexAttr = (Attribute *)
                  ::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                  ::end(&gprim->props);
      bVar1 = ::std::operator!=(&local_b90,(_Self *)&indexAttr);
      if (bVar1) {
        ppVar4 = ::std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
                 ::operator->(&local_b90);
        bVar1 = Property::is_attribute(&ppVar4->second);
        if (!bVar1) goto LAB_00488928;
        ppVar4 = ::std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
                 ::operator->(&local_b90);
        this = Property::get_attribute(&ppVar4->second);
        this_00 = GeomPrimvar::get_attribute((GeomPrimvar *)&kPrimvars);
        uVar2 = Attribute::type_id(this_00);
        if ((uVar2 & 0x100000) == 0) {
          ::std::__cxx11::ostringstream::ostringstream(local_d18);
          poVar3 = ::std::operator<<((ostream *)local_d18,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"GetGeomPrimvar");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xa76);
          ::std::operator<<(poVar3," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_d58,
                     "Indexed GeomPrimVar with scalar PrimVar Attribute is not supported. PrimVar name: {}"
                     ,&local_d59);
          fmt::format<std::__cxx11::string>
                    (local_d38,(string *)local_d58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it);
          poVar3 = ::std::operator<<((ostream *)local_d18,(string *)local_d38);
          ::std::operator<<(poVar3,"\n");
          ::std::__cxx11::string::~string((string *)local_d38);
          ::std::__cxx11::string::~string(local_d58);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_d59);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::__cxx11::string::operator+=
                      ((string *)err,
                       (string *)
                       &terminal_indexAttr._metas.stringData.
                        super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            ::std::__cxx11::string::~string
                      ((string *)
                       &terminal_indexAttr._metas.stringData.
                        super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          stage_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_d18);
          goto LAB_00488946;
        }
        bVar1 = Attribute::is_connection(this);
        if (bVar1) {
          Attribute::Attribute((Attribute *)local_1028);
          bVar1 = GetTerminalAttribute(stage,this,(string *)&indexIt,(Attribute *)local_1028,err);
          if (bVar1) {
            bVar1 = Attribute::has_value((Attribute *)local_1028);
            if ((bVar1) || (bVar1 = Attribute::has_timesamples((Attribute *)local_1028), bVar1)) {
              bVar1 = Attribute::has_timesamples((Attribute *)local_1028);
              if (bVar1) {
                pPVar8 = Attribute::get_var((Attribute *)local_1028);
                tss._24_8_ = tinyusdz::primvar::PrimVar::ts_raw(pPVar8);
                TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::TypedTimeSamples
                          ((TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *)local_11f0);
                bVar1 = TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::from_timesamples
                                  ((TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *)
                                   local_11f0,(TimeSamples *)tss._24_8_);
                if (bVar1) {
                  GeomPrimvar::set_timesampled_indices
                            ((GeomPrimvar *)&kPrimvars,
                             (TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *)local_11f0
                            );
                  bVar1 = false;
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream(local_1368);
                  poVar3 = ::std::operator<<((ostream *)local_1368,"[error]");
                  poVar3 = ::std::operator<<(poVar3,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                            );
                  poVar3 = ::std::operator<<(poVar3,":");
                  poVar3 = ::std::operator<<(poVar3,"GetGeomPrimvar");
                  poVar3 = ::std::operator<<(poVar3,"():");
                  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xa8c);
                  ::std::operator<<(poVar3," ");
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            (local_13a8,
                             "Index Attribute seems not an timesamples with int[] type: {}",
                             &local_13a9);
                  fmt::format<std::__cxx11::string>
                            (local_1388,(string *)local_13a8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &indexIt);
                  poVar3 = ::std::operator<<((ostream *)local_1368,(string *)local_1388);
                  ::std::operator<<(poVar3,"\n");
                  ::std::__cxx11::string::~string((string *)local_1388);
                  ::std::__cxx11::string::~string(local_13a8);
                  ::std::allocator<char>::~allocator((allocator<char> *)&local_13a9);
                  if (err != (string *)0x0) {
                    ::std::__cxx11::ostringstream::str();
                    ::std::__cxx11::string::operator+=
                              ((string *)err,
                               (string *)
                               &indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
                    ::std::__cxx11::string::~string
                              ((string *)
                               &indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
                  }
                  stage_local._7_1_ = 0;
                  bVar1 = true;
                  ::std::__cxx11::ostringstream::~ostringstream(local_1368);
                }
                TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::~TypedTimeSamples
                          ((TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *)local_11f0);
                if (bVar1) goto LAB_00488408;
              }
              bVar1 = Attribute::has_value((Attribute *)local_1028);
              if (bVar1) {
                ::std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)local_13e8);
                bVar1 = Attribute::get_value<std::vector<int,std::allocator<int>>>
                                  ((Attribute *)local_1028,
                                   (vector<int,_std::allocator<int>_> *)local_13e8);
                if (bVar1) {
                  GeomPrimvar::set_default_indices
                            ((GeomPrimvar *)&kPrimvars,
                             (vector<int,_std::allocator<int>_> *)local_13e8);
                  bVar1 = false;
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream(local_1560);
                  poVar3 = ::std::operator<<((ostream *)local_1560,"[error]");
                  poVar3 = ::std::operator<<(poVar3,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                            );
                  poVar3 = ::std::operator<<(poVar3,":");
                  poVar3 = ::std::operator<<(poVar3,"GetGeomPrimvar");
                  poVar3 = ::std::operator<<(poVar3,"():");
                  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xa99);
                  ::std::operator<<(poVar3," ");
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            (local_15a0,"Index Attribute is not int[] type. Got {}",&local_15a1);
                  Attribute::type_name_abi_cxx11_(&local_15c8,this);
                  fmt::format<std::__cxx11::string>
                            (local_1580,(string *)local_15a0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_15c8);
                  poVar3 = ::std::operator<<((ostream *)local_1560,(string *)local_1580);
                  ::std::operator<<(poVar3,"\n");
                  ::std::__cxx11::string::~string((string *)local_1580);
                  ::std::__cxx11::string::~string((string *)&local_15c8);
                  ::std::__cxx11::string::~string(local_15a0);
                  ::std::allocator<char>::~allocator((allocator<char> *)&local_15a1);
                  if (err != (string *)0x0) {
                    ::std::__cxx11::ostringstream::str();
                    ::std::__cxx11::string::operator+=((string *)err,local_15e8);
                    ::std::__cxx11::string::~string(local_15e8);
                  }
                  stage_local._7_1_ = 0;
                  bVar1 = true;
                  ::std::__cxx11::ostringstream::~ostringstream(local_1560);
                }
                ::std::vector<int,_std::allocator<int>_>::~vector
                          ((vector<int,_std::allocator<int>_> *)local_13e8);
                if (bVar1) goto LAB_00488408;
              }
              bVar1 = false;
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_11a8);
              poVar3 = ::std::operator<<((ostream *)local_11a8,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"GetGeomPrimvar");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xa83);
              ::std::operator<<(poVar3," ");
              poVar3 = ::std::operator<<((ostream *)local_11a8,
                                         "[Internal Error] Invalid Terminal Index Attribute. Terminal Index Attribute does not have `default` or timesamples value."
                                        );
              ::std::operator<<(poVar3,"\n");
              if (err != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::__cxx11::string::operator+=((string *)err,(string *)&ts);
                ::std::__cxx11::string::~string((string *)&ts);
              }
              stage_local._7_1_ = 0;
              bVar1 = true;
              ::std::__cxx11::ostringstream::~ostringstream(local_11a8);
            }
          }
          else {
            stage_local._7_1_ = 0;
            bVar1 = true;
          }
LAB_00488408:
          Attribute::~Attribute((Attribute *)local_1028);
          if (!bVar1) goto LAB_00488928;
        }
        else {
          bVar1 = Attribute::is_blocked(this);
          if (bVar1) goto LAB_00488928;
          bVar1 = Attribute::has_value(this);
          if ((bVar1) || (bVar1 = Attribute::has_timesamples(this), bVar1)) {
            bVar1 = Attribute::has_value(this);
            if (bVar1) {
              ::std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)local_1798);
              bVar1 = Attribute::get_value<std::vector<int,std::allocator<int>>>
                                (this,(vector<int,_std::allocator<int>_> *)local_1798);
              if (bVar1) {
                GeomPrimvar::set_default_indices
                          ((GeomPrimvar *)&kPrimvars,(vector<int,_std::allocator<int>_> *)local_1798
                          );
                bVar1 = false;
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_1910);
                poVar3 = ::std::operator<<((ostream *)local_1910,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"GetGeomPrimvar");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xab0);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_1950,"Index Attribute is not int[] type. Got {}",&local_1951);
                Attribute::type_name_abi_cxx11_(&local_1978,this);
                fmt::format<std::__cxx11::string>
                          (local_1930,(string *)local_1950,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1978);
                poVar3 = ::std::operator<<((ostream *)local_1910,(string *)local_1930);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_1930);
                ::std::__cxx11::string::~string((string *)&local_1978);
                ::std::__cxx11::string::~string(local_1950);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_1951);
                if (err != (string *)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::__cxx11::string::operator+=((string *)err,(string *)&ts_1);
                  ::std::__cxx11::string::~string((string *)&ts_1);
                }
                stage_local._7_1_ = 0;
                bVar1 = true;
                ::std::__cxx11::ostringstream::~ostringstream(local_1910);
              }
              ::std::vector<int,_std::allocator<int>_>::~vector
                        ((vector<int,_std::allocator<int>_> *)local_1798);
              if (bVar1) goto LAB_00488946;
            }
            bVar1 = Attribute::has_timesamples(this);
            if (bVar1) {
              pPVar8 = Attribute::get_var(this);
              tss_1._24_8_ = tinyusdz::primvar::PrimVar::ts_raw(pPVar8);
              TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::TypedTimeSamples
                        ((TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *)local_19c0);
              bVar1 = TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::from_timesamples
                                ((TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *)
                                 local_19c0,(TimeSamples *)tss_1._24_8_);
              if (bVar1) {
                GeomPrimvar::set_timesampled_indices
                          ((GeomPrimvar *)&kPrimvars,
                           (TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *)local_19c0);
                bVar1 = false;
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_1b38);
                poVar3 = ::std::operator<<((ostream *)local_1b38,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"GetGeomPrimvar");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xabb);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_1b78,"Index Attribute seems not an timesamples with int[] type: {}"
                           ,&local_1b79);
                fmt::format<std::__cxx11::string>
                          (local_1b58,(string *)local_1b78,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &indexIt);
                poVar3 = ::std::operator<<((ostream *)local_1b38,(string *)local_1b58);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_1b58);
                ::std::__cxx11::string::~string(local_1b78);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_1b79);
                if (err != (string *)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::__cxx11::string::operator+=((string *)err,local_1ba0);
                  ::std::__cxx11::string::~string(local_1ba0);
                }
                stage_local._7_1_ = 0;
                bVar1 = true;
                ::std::__cxx11::ostringstream::~ostringstream(local_1b38);
              }
              TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::~TypedTimeSamples
                        ((TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *)local_19c0);
              if (bVar1) goto LAB_00488946;
            }
            goto LAB_00488928;
          }
          ::std::__cxx11::ostringstream::ostringstream(local_1760);
          poVar3 = ::std::operator<<((ostream *)local_1760,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"GetGeomPrimvar");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xaa6);
          ::std::operator<<(poVar3," ");
          poVar3 = ::std::operator<<((ostream *)local_1760,
                                     "[Internal Error] Invalid Index Attribute. Index Attribute does not have `default` or timesamples value."
                                    );
          ::std::operator<<(poVar3,"\n");
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::__cxx11::string::operator+=
                      ((string *)err,
                       (string *)
                       &indices_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            ::std::__cxx11::string::~string
                      ((string *)
                       &indices_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
          }
          stage_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_1760);
        }
      }
      else {
LAB_00488928:
        GeomPrimvar::operator=(out_primvar,(GeomPrimvar *)&kPrimvars);
        stage_local._7_1_ = 1;
      }
LAB_00488946:
      ::std::__cxx11::string::~string((string *)&indexIt);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_b00);
      poVar3 = ::std::operator<<((ostream *)local_b00,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"GetGeomPrimvar");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xa67);
      ::std::operator<<(poVar3," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_b40,"{} is not Attribute(Maybe Relationship?).",&local_b41);
      fmt::format<std::__cxx11::string>
                (local_b20,(string *)local_b40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it);
      poVar3 = ::std::operator<<((ostream *)local_b00,(string *)local_b20);
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::string::~string((string *)local_b20);
      ::std::__cxx11::string::~string(local_b40);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_b41);
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=
                  ((string *)err,(string *)(index_name.field_2._M_local_buf + 8));
        ::std::__cxx11::string::~string((string *)(index_name.field_2._M_local_buf + 8));
      }
      stage_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_b00);
    }
  }
LAB_00488952:
  ::std::__cxx11::string::~string((string *)&it);
  GeomPrimvar::~GeomPrimvar((GeomPrimvar *)&kPrimvars);
LAB_0048896a:
  return (bool)(stage_local._7_1_ & 1);
}

Assistant:

bool GetGeomPrimvar(const Stage &stage, const GPrim *gprim,
                    const std::string &varname, GeomPrimvar *out_primvar,
                    std::string *err) {
  if (!out_primvar) {
    PUSH_ERROR_AND_RETURN("Output GeomPrimvar is nullptr.");
  }

  if (!gprim) {
    PUSH_ERROR_AND_RETURN("Input `gprim` arg is nullptr.");
  }

  GeomPrimvar primvar;

  constexpr auto kPrimvars = "primvars:";
  constexpr auto kIndices = ":indices";

  std::string primvar_name = kPrimvars + varname;

  const auto it = gprim->props.find(primvar_name);
  if (it == gprim->props.end()) {
    return false;
  }

  // The order of Attribute value evaluation:
  // - default or timesamples
  // - connection


  if (it->second.is_attribute()) {
    const Attribute &attr = it->second.get_attribute();

    if (attr.is_connection()) { // attribute only contains 'connection'
      // follow targetPath to get Attribute 
      Attribute terminal_attr;
      bool ret = tydra::GetTerminalAttribute(stage, attr, primvar_name,
                                             &terminal_attr, err);
      if (!ret) {
        return false;
      }

      primvar.set_value(terminal_attr);

    } else {
      // default, timeSamples
      primvar.set_value(attr);
    }

    primvar.set_name(varname);

    if (attr.metas().interpolation.has_value()) {
      primvar.set_interpolation(attr.metas().interpolation.value());
    }
    if (attr.metas().elementSize.has_value()) {
      primvar.set_elementSize(attr.metas().elementSize.value());
    }
    if (attr.metas().has_unauthoredValuesIndex()) {
      primvar.set_unauthoredValuesIndex(attr.metas().get_unauthoredValuesIndex());
    }
    // TODO: copy other attribute metas?

  } else {
    PUSH_ERROR_AND_RETURN(
        fmt::format("{} is not Attribute(Maybe Relationship?).", primvar_name));
  }

  // has indices?
  std::string index_name = primvar_name + kIndices;
  const auto indexIt = gprim->props.find(index_name);

  if (indexIt != gprim->props.end()) {
    if (indexIt->second.is_attribute()) {
      const Attribute &indexAttr = indexIt->second.get_attribute();

      if (!(primvar.get_attribute().type_id() & value::TYPE_ID_1D_ARRAY_BIT)) {
        PUSH_ERROR_AND_RETURN(
            fmt::format("Indexed GeomPrimVar with scalar PrimVar Attribute is "
                        "not supported. PrimVar name: {}",
                        primvar_name));
      }

      if (indexAttr.is_connection()) { // attribute only contains 'connection'
        // follow targetPath to get Attribute 
        Attribute terminal_indexAttr;
        bool ret = tydra::GetTerminalAttribute(stage, indexAttr, index_name,
                                               &terminal_indexAttr, err);
        if (!ret) {
          return false;
        }

        if (!terminal_indexAttr.has_value() && !terminal_indexAttr.has_timesamples()) {
          PUSH_ERROR_AND_RETURN("[Internal Error] Invalid Terminal Index Attribute. Terminal Index Attribute does not have `default` or timesamples value.");
        }

        if (terminal_indexAttr.has_timesamples()) {
          const auto &ts = terminal_indexAttr.get_var().ts_raw();
          TypedTimeSamples<std::vector<int32_t>> tss;
          if (!tss.from_timesamples(ts)) {
            PUSH_ERROR_AND_RETURN(fmt::format(
                "Index Attribute seems not an timesamples with int[] type: {}",
                index_name));
          }
        
          primvar.set_timesampled_indices(tss);
        }

        if (terminal_indexAttr.has_value()) {

          // TODO: Support uint[]?
          std::vector<int32_t> indices;
          if (!terminal_indexAttr.get_value(&indices)) {
            PUSH_ERROR_AND_RETURN(
                fmt::format("Index Attribute is not int[] type. Got {}",
                            indexAttr.type_name()));
          }

          primvar.set_default_indices(indices);

        }
      
      } else if (indexAttr.is_blocked()) {
        // Value blocked. e.g. `float2[] primvars:st:indices = None`
        // We can simply skip reading indices.
      } else {

        if (!indexAttr.has_value() && !indexAttr.has_timesamples()) {
          PUSH_ERROR_AND_RETURN("[Internal Error] Invalid Index Attribute. Index Attribute does not have `default` or timesamples value.");
        }

        if (indexAttr.has_value()) {
          // Check if int[] type.
          // TODO: Support uint[]?
          std::vector<int32_t> indices;
          if (!indexAttr.get_value(&indices)) {
            PUSH_ERROR_AND_RETURN(
                fmt::format("Index Attribute is not int[] type. Got {}",
                            indexAttr.type_name()));
          }


          primvar.set_default_indices(indices);
        }

        if (indexAttr.has_timesamples()) {
          const auto &ts = indexAttr.get_var().ts_raw();
          TypedTimeSamples<std::vector<int32_t>> tss;
          if (!tss.from_timesamples(ts)) {
            PUSH_ERROR_AND_RETURN(fmt::format("Index Attribute seems not an timesamples with int[] type: {}", index_name));
          }
        
          primvar.set_timesampled_indices(tss);
        }

      }
    } else {
      // indices are optional, so ok to skip it.
    }
  }

  (*out_primvar) = primvar;

  return true;
}